

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_mfiles.c
# Opt level: O0

void AppendNode(multi_files **first,multi_files **last,multi_files *new)

{
  multi_files *new_local;
  multi_files **last_local;
  multi_files **first_local;
  
  if (*last == (multi_files *)0x0) {
    *first = new;
  }
  else {
    (*last)->next = new;
  }
  *last = new;
  return;
}

Assistant:

static void AppendNode(struct multi_files **first,
                       struct multi_files **last,
                       struct multi_files  *new)
{
  DEBUGASSERT(((*first) && (*last)) || ((!*first) && (!*last)));

  if(*last)
    (*last)->next = new;
  else
    *first = new;
  *last = new;
}